

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# occurrencetocsv.cpp
# Opt level: O0

void occ_doit(void)

{
  undefined1 local_24 [8];
  occurrence q_1;
  occurrence_granular q;
  
  printf("event_id,period_no,occ_year,occ_month,occ_day");
  if (granular_date_ == 0) {
    printf("\n");
    occ_doit<occurrence>((occurrence *)local_24);
  }
  else {
    printf(",occ_hour,occ_minute\n");
    occ_doit<occurrence_granular>((occurrence_granular *)&q_1.period_no);
  }
  return;
}

Assistant:

void occ_doit()
{

	printf("event_id,period_no,occ_year,occ_month,occ_day");
	if (granular_date_) {
		printf(",occ_hour,occ_minute\n");
		occurrence_granular q;
		occ_doit(q);
	} else {
		printf("\n");
		occurrence q;
		occ_doit(q);
	}

}